

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QHostInfoRunnable_*>::data(QList<QHostInfoRunnable_*> *this)

{
  QArrayDataPointer<QHostInfoRunnable_*> *this_00;
  QHostInfoRunnable **ppQVar1;
  QArrayDataPointer<QHostInfoRunnable_*> *in_RDI;
  
  detach((QList<QHostInfoRunnable_*> *)0x22cd6c);
  this_00 = (QArrayDataPointer<QHostInfoRunnable_*> *)
            QArrayDataPointer<QHostInfoRunnable_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QHostInfoRunnable_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }